

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O2

void __thiscall
pbrt::KdTreeAggregate::buildTree
          (KdTreeAggregate *this,int nodeNum,Bounds3f *nodeBounds,
          vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> *allPrimBounds,
          int *primNums,int nPrimitives,int depth,
          unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *edges,int *prims0,
          int *prims1,int badRefines)

{
  Point3<float> *this_00;
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  KdTreeNode *__src;
  pointer pBVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  EdgeType *pEVar10;
  uint uVar11;
  KdTreeNode *pKVar12;
  Bounds3f *pBVar13;
  BoundEdge *pBVar14;
  Point3<float> *pPVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  pointer pBVar19;
  long lVar20;
  EdgeType *pEVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  BoundEdge *pBVar25;
  int iVar26;
  BoundEdge *__i;
  int i_1;
  ulong uVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar32 [56];
  undefined1 auVar31 [64];
  undefined1 auVar34 [60];
  undefined1 auVar33 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 in_register_00001544 [12];
  Vector3<float> VVar43;
  long lVar44;
  uint local_168;
  float local_15c;
  Bounds3f bounds1;
  Bounds3f bounds0;
  
  bounds0.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)nodeNum;
  bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)this->nextFreeNode;
  if (this->nextFreeNode != nodeNum) {
    LogFatal<char_const(&)[8],char_const(&)[13],char_const(&)[8],int&,char_const(&)[13],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
               ,0x365,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [8])"nodeNum",
               (char (*) [13])"nextFreeNode",(char (*) [8])"nodeNum",(int *)&bounds0,
               (char (*) [13])"nextFreeNode",(int *)&bounds1);
  }
  iVar16 = nodeNum;
  if (this->nAllocedNodes == nodeNum) {
    uVar27 = 0x200;
    if (0x200 < nodeNum * 2) {
      uVar27 = (ulong)(uint)(nodeNum * 2);
    }
    pKVar12 = (KdTreeNode *)operator_new__(uVar27 * 8);
    if (0 < nodeNum) {
      __src = this->nodes;
      memcpy(pKVar12,__src,(ulong)(uint)nodeNum << 3);
      if (__src != (KdTreeNode *)0x0) {
        operator_delete__(__src);
        iVar16 = this->nextFreeNode;
      }
    }
    this->nodes = pKVar12;
    this->nAllocedNodes = (int)uVar27;
  }
  this->nextFreeNode = iVar16 + 1;
  if ((depth == 0) || (nPrimitives <= this->maxPrims)) {
    KdTreeNode::InitLeaf(this->nodes + nodeNum,primNums,nPrimitives,&this->primitiveIndices);
    return;
  }
  fVar28 = (float)(this->isectCost * nPrimitives);
  fVar29 = Bounds3<float>::SurfaceArea(nodeBounds);
  uVar11 = Bounds3<float>::MaxDimension(nodeBounds);
  uVar9 = nPrimitives * 2;
  this_00 = &nodeBounds->pMax;
  lVar17 = (long)(int)uVar9;
  pfVar1 = &(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
  pfVar2 = &(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
  pfVar3 = &(nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
  pfVar4 = &(nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
  local_15c = INFINITY;
  iVar16 = 0;
  local_168 = 0xffffffff;
  while( true ) {
    pBVar6 = (allPrimBounds->
             super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    for (uVar27 = 0; uVar27 != (uint)(~(nPrimitives >> 0x1f) & nPrimitives); uVar27 = uVar27 + 1) {
      iVar24 = primNums[uVar27];
      pBVar19 = pBVar6 + iVar24;
      if (uVar11 == 1) {
        pBVar25 = edges[uVar11]._M_t.
                  super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                  .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
        pBVar14 = pBVar25 + uVar27 * 2;
        pBVar25[uVar27 * 2].t = (pBVar19->pMin).super_Tuple3<pbrt::Point3,_float>.y;
        lVar44 = 0x10;
      }
      else if (uVar11 == 0) {
        pBVar25 = edges[uVar11]._M_t.
                  super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                  .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
        pBVar14 = pBVar25 + uVar27 * 2;
        pBVar25[uVar27 * 2].t = (pBVar19->pMin).super_Tuple3<pbrt::Point3,_float>.x;
        lVar44 = 0xc;
      }
      else {
        pBVar25 = edges[(int)uVar11]._M_t.
                  super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                  .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
        pBVar14 = pBVar25 + uVar27 * 2;
        pBVar25[uVar27 * 2].t = (pBVar19->pMin).super_Tuple3<pbrt::Point3,_float>.z;
        lVar44 = 0x14;
      }
      pBVar14->primNum = iVar24;
      pBVar14->type = Start;
      uVar22 = (int)uVar27 * 2 | 1;
      pBVar25[uVar22].t =
           *(Float *)((long)&(pBVar19->pMin).super_Tuple3<pbrt::Point3,_float>.x + lVar44);
      pBVar25[uVar22].primNum = iVar24;
      pBVar25[uVar22].type = End;
    }
    if (nPrimitives != 0) {
      pBVar14 = edges[(int)uVar11]._M_t.
                super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t
                .super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
                super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
      std::
      __introsort_loop<pbrt::BoundEdge*,long,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                (pBVar14,pBVar14 + lVar17,(int)LZCOUNT(lVar17) * 2 ^ 0x7e);
      if (nPrimitives < 9) {
        std::
        __insertion_sort<pbrt::BoundEdge*,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                  (pBVar14,pBVar14 + lVar17);
      }
      else {
        pBVar25 = pBVar14 + 0x10;
        std::
        __insertion_sort<pbrt::BoundEdge*,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                  (pBVar14,pBVar25);
        for (lVar44 = lVar17 * 0xc + -0xc0; lVar44 != 0; lVar44 = lVar44 + -0xc) {
          std::
          __unguarded_linear_insert<pbrt::BoundEdge*,__gnu_cxx::__ops::_Val_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                    (pBVar25);
          pBVar25 = pBVar25 + 1;
        }
      }
    }
    uVar23 = (int)(uVar11 + 1) % 3;
    iVar24 = (int)(uVar11 + 2) % 3;
    lVar44 = 8;
    iVar26 = 0;
    uVar22 = 0xffffffff;
    iVar18 = nPrimitives;
    for (uVar27 = 0; (~((int)uVar9 >> 0x1f) & uVar9) != uVar27; uVar27 = uVar27 + 1) {
      pBVar14 = edges[(int)uVar11]._M_t.
                super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t
                .super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
                super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
      pBVar13 = nodeBounds;
      if ((uVar11 != 0) && (pBVar13 = (Bounds3f *)pfVar1, uVar11 != 1)) {
        pBVar13 = (Bounds3f *)pfVar2;
      }
      fVar5 = *(float *)((long)pBVar14 + lVar44 + -8);
      auVar34 = (undefined1  [60])0x0;
      iVar18 = iVar18 - (uint)(*(int *)((long)&pBVar14->t + lVar44) == 1);
      if ((pBVar13->pMin).super_Tuple3<pbrt::Point3,_float>.x < fVar5) {
        pPVar15 = this_00;
        if ((uVar11 != 0) && (pPVar15 = (Point3<float> *)pfVar3, uVar11 != 1)) {
          pPVar15 = (Point3<float> *)pfVar4;
        }
        auVar32 = (undefined1  [56])0x0;
        if (fVar5 < (pPVar15->super_Tuple3<pbrt::Point3,_float>).x) {
          VVar43 = Point3<float>::operator-(this_00,&nodeBounds->pMin);
          auVar33._0_4_ = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar33._4_60_ = auVar34;
          auVar31._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar31._8_56_ = auVar32;
          auVar30 = auVar31._0_16_;
          auVar8 = vmovshdup_avx(auVar30);
          auVar36 = auVar33._0_16_;
          auVar35 = auVar30;
          if ((uVar23 != 0) && (auVar35 = auVar36, uVar23 == 1)) {
            auVar35 = auVar8;
          }
          auVar37 = auVar30;
          if ((iVar24 != 0) && (auVar37 = auVar36, iVar24 == 1)) {
            auVar37 = auVar8;
          }
          pBVar13 = nodeBounds;
          if ((uVar11 != 0) && (pBVar13 = (Bounds3f *)pfVar1, uVar11 != 1)) {
            pBVar13 = (Bounds3f *)pfVar2;
          }
          fVar38 = VVar43.super_Tuple3<pbrt::Vector3,_float>.x;
          fVar39 = auVar8._0_4_;
          fVar40 = fVar38;
          if ((uVar23 != 0) && (fVar40 = auVar33._0_4_, uVar23 == 1)) {
            fVar40 = fVar39;
          }
          fVar41 = fVar38;
          if ((iVar24 != 0) && (fVar41 = auVar33._0_4_, iVar24 == 1)) {
            fVar41 = fVar39;
          }
          auVar42 = auVar30;
          if ((uVar23 != 0) && (auVar42 = auVar36, uVar23 == 1)) {
            auVar42 = auVar8;
          }
          if ((iVar24 != 0) && (auVar30 = auVar36, iVar24 == 1)) {
            auVar30 = auVar8;
          }
          pPVar15 = this_00;
          if ((uVar11 != 0) && (pPVar15 = (Point3<float> *)pfVar3, uVar11 != 1)) {
            pPVar15 = (Point3<float> *)pfVar4;
          }
          if ((uVar23 != 0) && (fVar38 = auVar33._0_4_, uVar23 == 1)) {
            fVar38 = fVar39;
          }
          if (iVar24 != 0) {
            if (iVar24 == 1) {
              auVar31 = ZEXT1664(auVar8);
            }
            else {
              auVar31 = ZEXT1664(auVar36);
            }
          }
          auVar8 = vfmadd213ss_fma(auVar37,auVar35,
                                   ZEXT416((uint)((fVar5 - (pBVar13->pMin).
                                                           super_Tuple3<pbrt::Point3,_float>.x) *
                                                 (fVar40 + fVar41))));
          auVar35 = vfmadd213ss_fma(auVar30,auVar42,
                                    ZEXT416((uint)(((pPVar15->super_Tuple3<pbrt::Point3,_float>).x -
                                                   fVar5) * (fVar38 + auVar31._0_4_))));
          fVar5 = 1.0 - this->emptyBonus;
          auVar36._0_4_ = (float)this->traversalCost;
          auVar36._4_12_ = in_register_00001544;
          auVar30._0_4_ = (float)iVar26;
          auVar30._4_12_ = in_register_00001544;
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)((1.0 / fVar29) * (auVar35._0_4_ + auVar35._0_4_) *
                                                 (float)iVar18)),
                                   ZEXT416((uint)((1.0 / fVar29) * (auVar8._0_4_ + auVar8._0_4_))),
                                   auVar30);
          auVar35 = vfmadd213ss_fma(auVar8,ZEXT416((uint)((float)((uint)(iVar18 == 0) * (int)fVar5 +
                                                                 (uint)(iVar18 != 0) *
                                                                 ((uint)(iVar26 == 0) * (int)fVar5 +
                                                                 (uint)(iVar26 != 0) * 0x3f800000))
                                                         * (float)this->isectCost)),auVar36);
          auVar8 = vminss_avx(auVar35,ZEXT416((uint)local_15c));
          if (auVar35._0_4_ < local_15c) {
            local_168 = (uint)uVar27;
            uVar22 = uVar11;
          }
          pBVar14 = edges[(int)uVar11]._M_t.
                    super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                    .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
          local_15c = auVar8._0_4_;
        }
      }
      iVar26 = iVar26 + (uint)(*(int *)((long)&pBVar14->t + lVar44) == 0);
      lVar44 = lVar44 + 0xc;
    }
    if ((iVar26 != nPrimitives) || (iVar18 != 0)) {
      LogFatal<char_const(&)[37]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                 ,0x3b1,"Check failed: %s",(char (*) [37])"nBelow == nPrimitives && nAbove == 0");
    }
    bVar7 = 1 < iVar16;
    if (bVar7 || uVar22 != 0xffffffff) break;
    iVar16 = iVar16 + 1;
    uVar11 = uVar23;
LAB_004011ba:
    if (bVar7 || uVar22 != 0xffffffff) {
      return;
    }
  }
  if (((nPrimitives < 0x10 && fVar28 * 4.0 < local_15c) || (uVar22 == 0xffffffff)) ||
     (badRefines = badRefines + (uint)(fVar28 < local_15c), badRefines == 3)) {
    KdTreeNode::InitLeaf(this->nodes + nodeNum,primNums,nPrimitives,&this->primitiveIndices);
    return;
  }
  iVar24 = 0;
  for (lVar44 = 0; (ulong)(~((int)local_168 >> 0x1f) & local_168) * 0xc - lVar44 != 0;
      lVar44 = lVar44 + 0xc) {
    pBVar14 = edges[(int)uVar22]._M_t.
              super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t.
              super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
              super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
    if (*(int *)((long)&pBVar14->type + lVar44) == 0) {
      lVar20 = (long)iVar24;
      iVar24 = iVar24 + 1;
      prims0[lVar20] = *(int *)((long)&pBVar14->primNum + lVar44);
    }
  }
  pBVar14 = edges[(int)uVar22]._M_t.
            super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t.
            super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
            super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
  lVar44 = (long)(int)local_168;
  uVar27 = 0;
  do {
    pEVar10 = &pBVar14[lVar44 + 1].type;
    do {
      pEVar21 = pEVar10;
      lVar44 = lVar44 + 1;
      if (lVar17 <= lVar44) {
        fVar5 = pBVar14[(int)local_168].t;
        bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.y =
             (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
        bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.z =
             (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
        bounds0.pMin.super_Tuple3<pbrt::Point3,_float>.x =
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
        bounds0.pMin.super_Tuple3<pbrt::Point3,_float>.y =
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
        bounds0._8_8_ = *(undefined8 *)&(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
        bounds1.pMax.super_Tuple3<pbrt::Point3,_float>.y =
             (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
        bounds1.pMax.super_Tuple3<pbrt::Point3,_float>.z =
             (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
        bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.x =
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
        bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.y =
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
        bounds1._8_8_ = *(undefined8 *)&(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
        if (uVar22 == 1) {
          bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar5;
          pPVar15 = (Point3<float> *)&bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        }
        else if (uVar22 == 0) {
          bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar5;
          pPVar15 = &bounds0.pMax;
        }
        else {
          pPVar15 = (Point3<float> *)&bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.z;
          bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar5;
        }
        (pPVar15->super_Tuple3<pbrt::Point3,_float>).x = fVar5;
        buildTree(this,nodeNum + 1,&bounds0,allPrimBounds,prims0,iVar24,depth + -1,edges,prims0,
                  prims1 + nPrimitives,badRefines);
        iVar24 = this->nextFreeNode;
        pKVar12 = this->nodes;
        pKVar12[nodeNum].field_0.onePrimitive = (int)fVar5;
        pKVar12[nodeNum].field_1.flags = iVar24 * 4 | uVar22;
        buildTree(this,iVar24,&bounds1,allPrimBounds,prims1,(int)uVar27,depth + -1,edges,prims0,
                  prims1 + nPrimitives,badRefines);
        goto LAB_004011ba;
      }
      pEVar10 = pEVar21 + 3;
    } while (*pEVar21 != End);
    prims1[uVar27] = pEVar21[-1];
    uVar27 = (ulong)((int)uVar27 + 1);
  } while( true );
}

Assistant:

void KdTreeAggregate::buildTree(int nodeNum, const Bounds3f &nodeBounds,
                                const std::vector<Bounds3f> &allPrimBounds, int *primNums,
                                int nPrimitives, int depth,
                                const std::unique_ptr<BoundEdge[]> edges[3], int *prims0,
                                int *prims1, int badRefines) {
    CHECK_EQ(nodeNum, nextFreeNode);
    // Get next free node from _nodes_ array
    if (nextFreeNode == nAllocedNodes) {
        int nNewAllocNodes = std::max(2 * nAllocedNodes, 512);
        KdTreeNode *n = new KdTreeNode[nNewAllocNodes];
        if (nAllocedNodes > 0) {
            memcpy(n, nodes, nAllocedNodes * sizeof(KdTreeNode));
            delete[] nodes;
        }
        nodes = n;
        nAllocedNodes = nNewAllocNodes;
    }
    ++nextFreeNode;

    // Initialize leaf node if termination criteria met
    if (nPrimitives <= maxPrims || depth == 0) {
        nodes[nodeNum].InitLeaf(primNums, nPrimitives, &primitiveIndices);
        return;
    }

    // Initialize interior node and continue recursion
    // Choose split axis position for interior node
    int bestAxis = -1, bestOffset = -1;
    Float bestCost = Infinity, leafCost = isectCost * nPrimitives;
    Float invTotalSA = 1 / nodeBounds.SurfaceArea();
    // Choose which axis to split along
    int axis = nodeBounds.MaxDimension();

    // Choose split along axis and attempt to partition primitives
    int retries = 0;
retrySplit:
    // Initialize edges for _axis_
    for (int i = 0; i < nPrimitives; ++i) {
        int pn = primNums[i];
        const Bounds3f &bounds = allPrimBounds[pn];
        edges[axis][2 * i] = BoundEdge(bounds.pMin[axis], pn, true);
        edges[axis][2 * i + 1] = BoundEdge(bounds.pMax[axis], pn, false);
    }
    // Sort _edges_ for _axis_
    std::sort(&edges[axis][0], &edges[axis][2 * nPrimitives],
              [](const BoundEdge &e0, const BoundEdge &e1) -> bool {
                  return std::tie(e0.t, e0.type) < std::tie(e1.t, e1.type);
              });

    // Compute cost of all splits for _axis_ to find best
    int nBelow = 0, nAbove = nPrimitives;
    for (int i = 0; i < 2 * nPrimitives; ++i) {
        if (edges[axis][i].type == EdgeType::End)
            --nAbove;
        Float edgeT = edges[axis][i].t;
        if (edgeT > nodeBounds.pMin[axis] && edgeT < nodeBounds.pMax[axis]) {
            // Compute child surface areas for split at _edgeT_
            Vector3f d = nodeBounds.pMax - nodeBounds.pMin;
            int otherAxis0 = (axis + 1) % 3, otherAxis1 = (axis + 2) % 3;
            Float belowSA =
                2 * (d[otherAxis0] * d[otherAxis1] +
                     (edgeT - nodeBounds.pMin[axis]) * (d[otherAxis0] + d[otherAxis1]));
            Float aboveSA =
                2 * (d[otherAxis0] * d[otherAxis1] +
                     (nodeBounds.pMax[axis] - edgeT) * (d[otherAxis0] + d[otherAxis1]));

            // Compute cost for split at _i_th edge
            Float pBelow = belowSA * invTotalSA, pAbove = aboveSA * invTotalSA;
            Float eb = (nAbove == 0 || nBelow == 0) ? emptyBonus : 0;
            Float cost = traversalCost +
                         isectCost * (1 - eb) * (pBelow * nBelow + pAbove * nAbove);
            // Update best split if this is lowest cost so far
            if (cost < bestCost) {
                bestCost = cost;
                bestAxis = axis;
                bestOffset = i;
            }
        }
        if (edges[axis][i].type == EdgeType::Start)
            ++nBelow;
    }
    CHECK(nBelow == nPrimitives && nAbove == 0);

    // Create leaf if no good splits were found
    if (bestAxis == -1 && retries < 2) {
        ++retries;
        axis = (axis + 1) % 3;
        goto retrySplit;
    }
    if (bestCost > leafCost)
        ++badRefines;
    if ((bestCost > 4 * leafCost && nPrimitives < 16) || bestAxis == -1 ||
        badRefines == 3) {
        nodes[nodeNum].InitLeaf(primNums, nPrimitives, &primitiveIndices);
        return;
    }

    // Classify primitives with respect to split
    int n0 = 0, n1 = 0;
    for (int i = 0; i < bestOffset; ++i)
        if (edges[bestAxis][i].type == EdgeType::Start)
            prims0[n0++] = edges[bestAxis][i].primNum;
    for (int i = bestOffset + 1; i < 2 * nPrimitives; ++i)
        if (edges[bestAxis][i].type == EdgeType::End)
            prims1[n1++] = edges[bestAxis][i].primNum;

    // Recursively initialize children nodes
    Float tSplit = edges[bestAxis][bestOffset].t;
    Bounds3f bounds0 = nodeBounds, bounds1 = nodeBounds;
    bounds0.pMax[bestAxis] = bounds1.pMin[bestAxis] = tSplit;
    buildTree(nodeNum + 1, bounds0, allPrimBounds, prims0, n0, depth - 1, edges, prims0,
              prims1 + nPrimitives, badRefines);
    int aboveChild = nextFreeNode;
    nodes[nodeNum].InitInterior(bestAxis, aboveChild, tSplit);
    buildTree(aboveChild, bounds1, allPrimBounds, prims1, n1, depth - 1, edges, prims0,
              prims1 + nPrimitives, badRefines);
}